

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_serialize.c
# Opt level: O3

char * serialize_put(char *w,SBufExt *sbx,cTValue *o)

{
  cTValue *pcVar1;
  int iVar2;
  long *plVar3;
  uint64_t uVar4;
  undefined8 uVar5;
  ulong uVar6;
  uint *puVar7;
  lua_State *L;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  char *pcVar14;
  byte *pbVar15;
  uint uVar16;
  cTValue *pcVar17;
  ulong uVar18;
  
  uVar18 = o->u64;
  uVar6 = (long)uVar18 >> 0x2f;
  iVar13 = (int)w;
  if (uVar6 == 0xfffffffffffffffb) {
    uVar10 = *(uint *)((uVar18 & 0x7fffffffffff) + 0x14);
    if ((uint)(*(int *)&sbx->e - iVar13) < uVar10 + 5) {
      sbx->w = w;
      w = lj_buf_more2((SBuf *)sbx,uVar10 + 5);
    }
    uVar11 = uVar10 + 0x20;
    if (uVar11 < 0xe0) {
      *w = (char)uVar11;
      pcVar14 = w + 1;
    }
    else {
      pcVar14 = serialize_wu124_(w,uVar11);
    }
    memcpy(pcVar14,(void *)((uVar18 & 0x7fffffffffff) + 0x18),(ulong)uVar10);
    return pcVar14 + uVar10;
  }
  if (uVar6 < 0xfffffffffffffff2) {
    if ((uint)(*(int *)&sbx->e - iVar13) < 9) {
      sbx->w = w;
      w = lj_buf_more2((SBuf *)sbx,9);
    }
    *w = 7;
LAB_00122cce:
    *(ulong *)((byte *)w + 1) = uVar18;
LAB_00122cd2:
    pbVar15 = (byte *)w + 9;
  }
  else {
    if (uVar6 < 0xfffffffffffffffd) {
      if (uVar6 == 0xfffffffffffffff4) {
        if (sbx->depth < 1) {
          lj_err_caller((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),LJ_ERR_BUFFER_DEPTH);
        }
        uVar18 = uVar18 & 0x7fffffffffff;
        sbx->depth = sbx->depth + -1;
        uVar6 = (ulong)*(uint *)(uVar18 + 0x30);
        uVar10 = 0;
        uVar11 = 2;
        if (uVar6 == 0) {
LAB_00122e7b:
          uVar16 = 0;
        }
        else {
          uVar16 = *(uint *)(uVar18 + 0x30) + 1;
          do {
            if ((long)uVar6 < 1) goto LAB_00122e7b;
            uVar16 = uVar16 - 1;
            lVar9 = uVar6 - 1;
            uVar6 = uVar6 - 1;
          } while ((*(long **)(uVar18 + 0x10))[lVar9] == -1);
          uVar11 = (uint)(**(long **)(uVar18 + 0x10) == -1) * 2 + 2;
        }
        iVar2 = *(int *)(uVar18 + 0x34);
        if (iVar2 != 0) {
          lVar9 = 0;
          uVar10 = 0;
          do {
            uVar10 = uVar10 + (*(long *)(*(long *)(uVar18 + 0x28) + lVar9) != -1);
            lVar9 = lVar9 + 0x18;
          } while ((ulong)(iVar2 + 1 + (uint)(iVar2 == -1)) * 0x18 != lVar9);
        }
        uVar4 = (sbx->dict_mt).gcptr64;
        if ((uVar4 != 0) && (uVar6 = *(ulong *)(uVar18 + 0x20), uVar6 != 0)) {
          uVar12 = (uint)((uVar6 | 0xfffa000000000000) >> 0x20);
          uVar8 = ((uint)uVar6 ^ uVar12) - (uVar12 << 0xe | uVar12 >> 0x12);
          puVar7 = (uint *)((ulong)(((uVar12 << 0x13 | uVar12 >> 0xd) ^ uVar8) -
                                    (uVar8 * 0x2000 | uVar8 >> 0x13) & *(uint *)(uVar4 + 0x34)) *
                            0x18 + *(long *)(uVar4 + 0x28));
          do {
            if (*(ulong *)(puVar7 + 2) == (uVar6 | 0xfffa000000000000)) {
              uVar8 = *puVar7;
              if ((uint)(*(int *)&sbx->e - iVar13) < 6) {
                sbx->w = w;
                w = lj_buf_more2((SBuf *)sbx,6);
              }
              *w = '\x0e';
              if (uVar8 < 0xe0) {
                w[1] = (char)uVar8;
                w = w + 2;
              }
              else {
                w = serialize_wu124_(w + 1,uVar8);
              }
              break;
            }
            puVar7 = *(uint **)(puVar7 + 4);
          } while (puVar7 != (uint *)0x0);
        }
        if ((uint)(*(int *)&sbx->e - (int)w) < 0xb) {
          sbx->w = w;
          w = lj_buf_more2((SBuf *)sbx,0xb);
        }
        uVar8 = uVar11;
        if (uVar16 == 0) {
          uVar8 = 0;
        }
        pbVar15 = (byte *)w + 1;
        *w = (byte)uVar8 | uVar10 == 0 ^ 9U;
        if (uVar16 != 0) {
          if (uVar16 < 0xe0) {
            ((byte *)w)[1] = (byte)uVar16;
            pbVar15 = (byte *)w + 2;
          }
          else {
            pbVar15 = (byte *)serialize_wu124_((char *)pbVar15,uVar16);
          }
        }
        if (uVar10 != 0) {
          if (uVar10 < 0xe0) {
            *pbVar15 = (byte)uVar10;
            pbVar15 = pbVar15 + 1;
          }
          else {
            pbVar15 = (byte *)serialize_wu124_((char *)pbVar15,uVar10);
          }
        }
        if ((uVar16 != 0) && (uVar11 >> 2 < uVar16)) {
          lVar9 = *(long *)(uVar18 + 0x10);
          pcVar17 = (cTValue *)(lVar9 + (ulong)(uVar11 >> 2) * 8);
          do {
            pcVar1 = pcVar17 + 1;
            pbVar15 = (byte *)serialize_put((char *)pbVar15,sbx,pcVar17);
            pcVar17 = pcVar1;
          } while (pcVar1 < (cTValue *)(lVar9 + (ulong)uVar16 * 8));
        }
        if (uVar10 == 0) {
LAB_0012312f:
          sbx->depth = sbx->depth + 1;
          return (char *)pbVar15;
        }
        pcVar17 = (cTValue *)((ulong)*(uint *)(uVar18 + 0x34) * 0x18 + *(long *)(uVar18 + 0x28));
        uVar4 = (sbx->dict_str).gcptr64;
        if (uVar4 == 0) {
          do {
            if (pcVar17->u64 != 0xffffffffffffffff) {
              pcVar14 = serialize_put((char *)pbVar15,sbx,pcVar17 + 1);
              pbVar15 = (byte *)serialize_put(pcVar14,sbx,pcVar17);
              uVar10 = uVar10 - 1;
              if (uVar10 == 0) goto LAB_0012312f;
            }
            pcVar17 = pcVar17 + -3;
          } while( true );
        }
        do {
          if (pcVar17->u64 != 0xffffffffffffffff) {
            if ((pcVar17[1].u64 & 0xffff800000000000) == 0xfffd800000000000) {
              uVar18 = pcVar17[1].u64 & 0x7fffffffffff;
              puVar7 = (uint *)((ulong)(*(uint *)(uVar4 + 0x34) & *(uint *)(uVar18 + 0xc)) * 0x18 +
                               *(long *)(uVar4 + 0x28));
              do {
                if (((*(ulong *)(puVar7 + 2) & 0xffff800000000000) == 0xfffd800000000000) &&
                   ((*(ulong *)(puVar7 + 2) & 0x7fffffffffff) == uVar18)) {
                  uVar11 = *puVar7;
                  if ((uint)(*(int *)&sbx->e - (int)pbVar15) < 6) {
                    sbx->w = (char *)pbVar15;
                    pbVar15 = (byte *)lj_buf_more2((SBuf *)sbx,6);
                  }
                  *pbVar15 = 0xf;
                  if (uVar11 < 0xe0) {
                    pbVar15[1] = (byte)uVar11;
                    pbVar15 = pbVar15 + 2;
                  }
                  else {
                    pbVar15 = (byte *)serialize_wu124_((char *)(pbVar15 + 1),uVar11);
                  }
                  goto LAB_00123080;
                }
                puVar7 = *(uint **)(puVar7 + 4);
              } while (puVar7 != (uint *)0x0);
              uVar11 = *(uint *)(uVar18 + 0x14);
              if ((uint)(*(int *)&sbx->e - (int)pbVar15) < uVar11 + 5) {
                sbx->w = (char *)pbVar15;
                pbVar15 = (byte *)lj_buf_more2((SBuf *)sbx,uVar11 + 5);
              }
              uVar16 = uVar11 + 0x20;
              if (uVar16 < 0xe0) {
                *pbVar15 = (byte)uVar16;
                pbVar15 = pbVar15 + 1;
              }
              else {
                pbVar15 = (byte *)serialize_wu124_((char *)pbVar15,uVar16);
              }
              memcpy(pbVar15,(void *)(uVar18 + 0x18),(ulong)uVar11);
              pbVar15 = pbVar15 + uVar11;
            }
            else {
              pbVar15 = (byte *)serialize_put((char *)pbVar15,sbx,pcVar17 + 1);
            }
LAB_00123080:
            pbVar15 = (byte *)serialize_put((char *)pbVar15,sbx,pcVar17);
            uVar10 = uVar10 - 1;
            if (uVar10 == 0) goto LAB_0012312f;
          }
          pcVar17 = pcVar17 + -3;
        } while( true );
      }
      if (uVar6 == 0xfffffffffffffff5) {
        L = (lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8);
        plVar3 = *(long **)((L->glref).ptr64 + 0x180);
        plVar3[2] = (long)L;
        uVar18 = o->it64;
        uVar6 = uVar18 & 0x7fffffffffff;
        lVar9 = *plVar3;
        uVar10 = *(uint *)(lVar9 + (ulong)*(ushort *)(uVar6 + 10) * 0x18);
        puVar7 = (uint *)(lVar9 + (ulong)*(ushort *)(uVar6 + 10) * 0x18);
        if ((0x3ffffff < uVar10) || (puVar7[1] != 8)) {
          if (((uVar10 & 0xf4000000) == 0x34000000) && (puVar7[1] == 0x10)) {
            if ((uint)(*(int *)&sbx->e - iVar13) < 0x11) {
              sbx->w = w;
              w = lj_buf_more2((SBuf *)sbx,0x11);
            }
            *w = '\x12';
            uVar5 = *(undefined8 *)(uVar6 + 0x18);
            *(undefined8 *)(w + 1) = *(undefined8 *)(uVar6 + 0x10);
            *(undefined8 *)(w + 9) = uVar5;
            return w + 0x11;
          }
          goto LAB_001232df;
        }
        if ((uint)(*(int *)&sbx->e - iVar13) < 9) {
          sbx->w = w;
          w = lj_buf_more2((SBuf *)sbx,9);
          uVar10 = *puVar7;
        }
        *w = (uVar10 >> 0x17 & 1) == 0 ^ 0x11;
        *(undefined8 *)((byte *)w + 1) = *(undefined8 *)(uVar6 + 0x10);
        goto LAB_00122cd2;
      }
      if (uVar6 != 0xfffffffffffffffc) {
        L = (lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8);
LAB_001232df:
        uVar6 = 0xd;
        if (0xfffffffffffffff2 < (ulong)((long)uVar18 >> 0x2f)) {
          uVar6 = ~((long)uVar18 >> 0x2f);
        }
        lj_err_callerv(L,LJ_ERR_BUFFER_BADENC,lj_obj_itypename[uVar6]);
      }
      uVar6 = uVar18 >> 0x27 & 0xff;
      if (uVar6 == 0xff) {
        uVar18 = 0;
      }
      else {
        uVar18 = uVar18 & 0x7fffffffff |
                 (ulong)*(uint *)(*(long *)(*(long *)(((sbx->L).ptr64 & 0xfffffffffffffff8) + 0x10)
                                           + 0x70) + uVar6 * 4) << 0x20;
      }
      if ((uint)(*(int *)&sbx->e - iVar13) < 9) {
        sbx->w = w;
        w = lj_buf_more2((SBuf *)sbx,9);
      }
      if (uVar18 != 0) {
        if (uVar18 >> 0x20 == 0) {
          *w = 4;
          *(int *)((byte *)w + 1) = (int)uVar18;
          return (char *)((byte *)w + 5);
        }
        *w = 5;
        goto LAB_00122cce;
      }
      *w = 3;
    }
    else {
      if (*(int *)&sbx->e == iVar13) {
        sbx->w = w;
        w = lj_buf_more2((SBuf *)sbx,1);
        uVar18 = o->u64;
      }
      *w = ~(byte)(uVar18 >> 0x2f);
    }
    pbVar15 = (byte *)w + 1;
  }
  return (char *)pbVar15;
}

Assistant:

static char *serialize_put(char *w, SBufExt *sbx, cTValue *o)
{
  if (LJ_LIKELY(tvisstr(o))) {
    const GCstr *str = strV(o);
    MSize len = str->len;
    w = serialize_more(w, sbx, 5+len);
    w = serialize_wu124(w, SER_TAG_STR + len);
    w = lj_buf_wmem(w, strdata(str), len);
  } else if (tvisint(o)) {
    uint32_t x = LJ_BE ? lj_bswap((uint32_t)intV(o)) : (uint32_t)intV(o);
    w = serialize_more(w, sbx, 1+4);
    *w++ = SER_TAG_INT; memcpy(w, &x, 4); w += 4;
  } else if (tvisnum(o)) {
    uint64_t x = LJ_BE ? lj_bswap64(o->u64) : o->u64;
    w = serialize_more(w, sbx, 1+sizeof(lua_Number));
    *w++ = SER_TAG_NUM; memcpy(w, &x, 8); w += 8;
  } else if (tvispri(o)) {
    w = serialize_more(w, sbx, 1);
    *w++ = (char)(SER_TAG_NIL + ~itype(o));
  } else if (tvistab(o)) {
    const GCtab *t = tabV(o);
    uint32_t narray = 0, nhash = 0, one = 2;
    if (sbx->depth <= 0) lj_err_caller(sbufL(sbx), LJ_ERR_BUFFER_DEPTH);
    sbx->depth--;
    if (t->asize > 0) {  /* Determine max. length of array part. */
      ptrdiff_t i;
      TValue *array = tvref(t->array);
      for (i = (ptrdiff_t)t->asize-1; i >= 0; i--)
	if (!tvisnil(&array[i]))
	  break;
      narray = (uint32_t)(i+1);
      if (narray && tvisnil(&array[0])) one = 4;
    }
    if (t->hmask > 0) {  /* Count number of used hash slots. */
      uint32_t i, hmask = t->hmask;
      Node *node = noderef(t->node);
      for (i = 0; i <= hmask; i++)
	nhash += !tvisnil(&node[i].val);
    }
    /* Write metatable index. */
    if (LJ_UNLIKELY(tabref(sbx->dict_mt)) && tabref(t->metatable)) {
      TValue mto;
      Node *n;
      settabV(sbufL(sbx), &mto, tabref(t->metatable));
      n = hashgcref(tabref(sbx->dict_mt), mto.gcr);
      do {
	if (n->key.u64 == mto.u64) {
	  uint32_t idx = n->val.u32.lo;
	  w = serialize_more(w, sbx, 1+5);
	  *w++ = SER_TAG_DICT_MT;
	  w = serialize_wu124(w, idx);
	  break;
	}
      } while ((n = nextnode(n)));
    }
    /* Write number of array slots and hash slots. */
    w = serialize_more(w, sbx, 1+2*5);
    *w++ = (char)(SER_TAG_TAB + (nhash ? 1 : 0) + (narray ? one : 0));
    if (narray) w = serialize_wu124(w, narray);
    if (nhash) w = serialize_wu124(w, nhash);
    if (narray) {  /* Write array entries. */
      cTValue *oa = tvref(t->array) + (one >> 2);
      cTValue *oe = tvref(t->array) + narray;
      while (oa < oe) w = serialize_put(w, sbx, oa++);
    }
    if (nhash) {  /* Write hash entries. */
      const Node *node = noderef(t->node) + t->hmask;
      GCtab *dict_str = tabref(sbx->dict_str);
      if (LJ_UNLIKELY(dict_str)) {
	for (;; node--)
	  if (!tvisnil(&node->val)) {
	    if (LJ_LIKELY(tvisstr(&node->key))) {
	      /* Inlined lj_tab_getstr is 30% faster. */
	      const GCstr *str = strV(&node->key);
	      Node *n = hashstr(dict_str, str);
	      do {
		if (tvisstr(&n->key) && strV(&n->key) == str) {
		  uint32_t idx = n->val.u32.lo;
		  w = serialize_more(w, sbx, 1+5);
		  *w++ = SER_TAG_DICT_STR;
		  w = serialize_wu124(w, idx);
		  break;
		}
		n = nextnode(n);
		if (!n) {
		  MSize len = str->len;
		  w = serialize_more(w, sbx, 5+len);
		  w = serialize_wu124(w, SER_TAG_STR + len);
		  w = lj_buf_wmem(w, strdata(str), len);
		  break;
		}
	      } while (1);
	    } else {
	      w = serialize_put(w, sbx, &node->key);
	    }
	    w = serialize_put(w, sbx, &node->val);
	    if (--nhash == 0) break;
	  }
      } else {
	for (;; node--)
	  if (!tvisnil(&node->val)) {
	    w = serialize_put(w, sbx, &node->key);
	    w = serialize_put(w, sbx, &node->val);
	    if (--nhash == 0) break;
	  }
      }
    }
    sbx->depth++;
#if LJ_HASFFI
  } else if (tviscdata(o)) {
    CTState *cts = ctype_cts(sbufL(sbx));
    CType *s = ctype_raw(cts, cdataV(o)->ctypeid);
    uint8_t *sp = cdataptr(cdataV(o));
    if (ctype_isinteger(s->info) && s->size == 8) {
      w = serialize_more(w, sbx, 1+8);
      *w++ = (s->info & CTF_UNSIGNED) ? SER_TAG_UINT64 : SER_TAG_INT64;
#if LJ_BE
      { uint64_t u = lj_bswap64(*(uint64_t *)sp); memcpy(w, &u, 8); }
#else
      memcpy(w, sp, 8);
#endif
      w += 8;
    } else if (ctype_iscomplex(s->info) && s->size == 16) {
      w = serialize_more(w, sbx, 1+16);
      *w++ = SER_TAG_COMPLEX;
#if LJ_BE
      {  /* Only swap the doubles. The re/im order stays the same. */
	uint64_t u = lj_bswap64(((uint64_t *)sp)[0]); memcpy(w, &u, 8);
	u = lj_bswap64(((uint64_t *)sp)[1]); memcpy(w+8, &u, 8);
      }
#else
      memcpy(w, sp, 16);
#endif
      w += 16;
    } else {
      goto badenc;  /* NYI other cdata */
    }
#endif
  } else if (tvislightud(o)) {
    uintptr_t ud = (uintptr_t)lightudV(G(sbufL(sbx)), o);
    w = serialize_more(w, sbx, 1+sizeof(ud));
    if (ud == 0) {
      *w++ = SER_TAG_NULL;
    } else if (LJ_32 || checku32(ud)) {
#if LJ_BE && LJ_64
      ud = lj_bswap64(ud);
#elif LJ_BE
      ud = lj_bswap(ud);
#endif
      *w++ = SER_TAG_LIGHTUD32; memcpy(w, &ud, 4); w += 4;
#if LJ_64
    } else {
#if LJ_BE
      ud = lj_bswap64(ud);
#endif
      *w++ = SER_TAG_LIGHTUD64; memcpy(w, &ud, 8); w += 8;
#endif
    }
  } else {
    /* NYI userdata */
#if LJ_HASFFI
  badenc:
#endif
    lj_err_callerv(sbufL(sbx), LJ_ERR_BUFFER_BADENC, lj_typename(o));
  }
  return w;
}